

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication_proxy.cpp
# Opt level: O0

void try_it(IPingable *p)

{
  ostream *this;
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  IPingable *local_10;
  IPingable *p_local;
  
  local_10 = p;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"PING",&local_51);
  (*p->_vptr_IPingable[2])(local_30,p,local_50);
  this = std::operator<<((ostream *)&std::cout,local_30);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

void try_it(IPingable& p)
{
	std::cout << p.ping("PING") << std::endl;
}